

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O3

Data * DL::Expressions::union_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *param_2)

{
  _Alloc_hider _Var1;
  pointer pcVar2;
  pointer pDVar3;
  pointer pDVar4;
  anon_union_8_3_90dad22a_for_Data_2 aVar5;
  undefined4 uVar6;
  long lVar7;
  vector_t<Data> *pvVar8;
  Data *data_1;
  pointer pDVar9;
  Data *data;
  pointer pDVar10;
  DataGroup grp;
  string_t local_68;
  DataGroup local_48;
  Data *local_38;
  
  pDVar10 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = ((long)(args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar10 >> 5) * -0x5555555555555555;
  if (lVar7 == 1) {
    (__return_storage_ptr__->mKey)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mKey).field_2;
    _Var1._M_p = (pDVar10->mKey)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var1._M_p,
               _Var1._M_p + (pDVar10->mKey)._M_string_length);
    uVar6 = *(undefined4 *)&pDVar10->field_0x24;
    aVar5 = pDVar10->field_2;
    __return_storage_ptr__->mType = pDVar10->mType;
    *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar6;
    __return_storage_ptr__->field_2 = aVar5;
    DataGroup::DataGroup(&__return_storage_ptr__->mGroup,&pDVar10->mGroup);
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    pcVar2 = (pDVar10->mString)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mString,pcVar2,
               pcVar2 + (pDVar10->mString)._M_string_length);
  }
  else if (lVar7 == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Data::Data(__return_storage_ptr__,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    DataGroup::DataGroup(&local_48,&local_68);
    local_38 = __return_storage_ptr__;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pDVar10 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pDVar3 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pDVar10 != pDVar3) {
      do {
        if (pDVar10->mType == DT_Group) {
          pvVar8 = DataGroup::getNamedEntries(&pDVar10->mGroup);
          pDVar4 = (pvVar8->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar9 = (pvVar8->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                        super__Vector_impl_data._M_start; pDVar9 != pDVar4; pDVar9 = pDVar9 + 1) {
            DataGroup::add(&local_48,pDVar9);
          }
          if (pDVar10->mType != DT_Group) {
            __assert_fail("(mType == DT_Group)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/Data.inl"
                          ,0x3b,"const DataGroup &DL::Data::getGroup() const");
          }
          pvVar8 = DataGroup::getAnonymousEntries(&pDVar10->mGroup);
          pDVar4 = (pvVar8->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar9 = (pvVar8->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                        super__Vector_impl_data._M_start; pDVar9 != pDVar4; pDVar9 = pDVar9 + 1) {
            DataGroup::add(&local_48,pDVar9);
          }
        }
        else {
          DataGroup::add(&local_48,pDVar10);
        }
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar3);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    __return_storage_ptr__ = local_38;
    Data::Data(local_38,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__->mType = DT_Group;
    DataGroup::operator=(&__return_storage_ptr__->mGroup,&local_48);
    DataGroup::~DataGroup(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Data union_func(const vector_t<Data>& args, VM& /*vm*/)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return args.front();
	} else {
		DataGroup grp;
		for (const Data& d : args) {
			if (d.type() == DT_Group) {
				for (const Data& data : d.getGroup().getNamedEntries())
					grp.add(data);

				for (const Data& data : d.getGroup().getAnonymousEntries())
					grp.add(data);
			} else {
				grp.add(d);
			}
		}

		Data r;
		r.setGroup(grp);
		return r;
	}
}